

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,TPZGeoBlend<pzgeom::TPZGeoQuad> *cp)

{
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  int is;
  size_t in_stack_00000368;
  char *in_stack_00000370;
  TPZTransform<double> *in_stack_ffffffffffffff48;
  TPZTransform<double> *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  TPZGeoQuad *in_stack_ffffffffffffff60;
  TPZTransform<double> *in_stack_ffffffffffffff70;
  TPZRegisterClassId *local_60;
  TPZRegisterClassId *local_38;
  int local_30;
  
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>(in_RDI,0x21);
  TPZGeoQuad::TPZGeoQuad
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (TPZGeoQuad *)in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoBlend_02450170;
  local_38 = in_RDI + 0x30;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff50);
    local_38 = local_38 + 0x18;
  } while (local_38 != in_RDI + 0xc0);
  local_60 = in_RDI + 0xc0;
  do {
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffff70);
    local_60 = local_60 + 0x1a0;
  } while (local_60 != in_RDI + 0xa80);
  for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_30 * 0x18 + 0x30),
               (TPZGeoElSideIndex *)(in_RSI + 0x30 + (long)local_30 * 0x18));
    TPZTransform<double>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  *(undefined8 *)(in_RDI + 0x28) = 0;
  pzinternal::DebugStopImpl(in_stack_00000370,in_stack_00000368);
  return;
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }